

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

void setupTransmit(char *ip)

{
  sockaddr_in sVar1;
  in_addr_t iVar2;
  int iVar3;
  
  printf("IP: %s \n \n",ip);
  socket(2,2,0x11);
  server._2_14_ = SUB1614(ZEXT816(0),2);
  server.sin_family = 2;
  iVar2 = inet_addr(ip);
  sVar1 = server;
  server.sin_addr.s_addr = iVar2;
  server.sin_family = sVar1.sin_family;
  server.sin_port = 0xad16;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
  if (iVar3 == 0) {
    setup = true;
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void setupTransmit(const char* ip) {
	printf("IP: %s \n \n", ip);	
	const char *buffer = "test UDP packet";
	int s = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP); 
	//bzero(&server, sizeof(server));	
	memset(&server, 0, sizeof(server));
	server.sin_family = AF_INET;
	server.sin_addr.s_addr = inet_addr(ip);
	server.sin_port = htons(PORT);
	mutex.lock();
	setup = true;
	mutex.unlock();
	//std::thread recvThread(recvUDP);
	//recvThread.detach();
}